

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_parser.cpp
# Opt level: O0

bool __thiscall duckdb::SQLLogicParser::NextStatement(SQLLogicParser *this)

{
  bool bVar1;
  size_type sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar3;
  long in_RDI;
  string *in_stack_00000038;
  size_type in_stack_ffffffffffffffc8;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_ffffffffffffffd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  undefined1 local_21;
  undefined1 local_11;
  
  if ((*(byte *)(in_RDI + 0x41) & 1) != 0) {
    while( true ) {
      uVar4 = *(ulong *)(in_RDI + 0x38);
      sVar2 = Catch::clara::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x20));
      local_11 = 0;
      if (uVar4 < sVar2) {
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        bVar1 = EmptyOrComment(in_stack_00000038);
        local_11 = bVar1 ^ 0xff;
      }
      if ((local_11 & 1) == 0) break;
      *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 1;
    }
  }
  *(undefined1 *)(in_RDI + 0x41) = 1;
  while( true ) {
    this_00 = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                **)(in_RDI + 0x38);
    pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)Catch::clara::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x20));
    local_21 = false;
    if (this_00 < pvVar3) {
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator[](this_00,in_stack_ffffffffffffffc8);
      local_21 = EmptyOrComment(in_stack_00000038);
    }
    if (local_21 == false) break;
    *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 1;
  }
  uVar4 = *(ulong *)(in_RDI + 0x38);
  sVar2 = Catch::clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x20));
  return uVar4 < sVar2;
}

Assistant:

bool SQLLogicParser::NextStatement() {
	if (seen_statement) {
		// skip the current statement
		// but only if we have already seen a statement in the file
		while (current_line < lines.size() && !EmptyOrComment(lines[current_line])) {
			current_line++;
		}
	}
	seen_statement = true;
	// now look for the first non-empty line
	while (current_line < lines.size() && EmptyOrComment(lines[current_line])) {
		current_line++;
	}
	// return whether or not we reached the end of the file
	return current_line < lines.size();
}